

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_traversal.c
# Opt level: O0

void append_float(t_append *x,t_float f)

{
  t_symbol *s;
  t_gstub *ptVar1;
  _glist *owner;
  _scalar *p_Var2;
  int iVar3;
  t_gpointer *gp_00;
  t_template *x_00;
  t_scalar *x_01;
  _glist *x_02;
  _glist *glist;
  t_scalar *oldsc;
  t_scalar *sc;
  t_word *vec;
  t_gstub *gs;
  t_gpointer *gp;
  t_appendvariable *vp;
  t_template *template;
  t_symbol *templatesym;
  int i;
  int nitems;
  t_float f_local;
  t_append *x_local;
  
  iVar3 = x->x_nin;
  s = x->x_templatesym;
  gp_00 = &x->x_gp;
  ptVar1 = (x->x_gp).gp_stub;
  if (s->s_name == (char *)0x0) {
    pd_error(x,"append: no template supplied");
  }
  else {
    x_00 = template_findbyname(s);
    if (x_00 == (t_template *)0x0) {
      pd_error(x,"append: couldn\'t find template %s",s->s_name);
    }
    else if (ptVar1 == (t_gstub *)0x0) {
      pd_error(x,"append: no current pointer");
    }
    else if (ptVar1->gs_which == 1) {
      owner = (ptVar1->gs_un).gs_glist;
      if (owner->gl_valid == (x->x_gp).gp_valid) {
        if (iVar3 != 0) {
          x->x_variables->gv_f = f;
          x_01 = scalar_new(owner,s);
          if (x_01 == (t_scalar *)0x0) {
            pd_error(x,"%s: couldn\'t create scalar",s->s_name);
          }
          else {
            p_Var2 = (gp_00->gp_un).gp_scalar;
            if (p_Var2 == (_scalar *)0x0) {
              (x_01->sc_gobj).g_next = owner->gl_list;
              owner->gl_list = &x_01->sc_gobj;
            }
            else {
              (x_01->sc_gobj).g_next = (p_Var2->sc_gobj).g_next;
              (p_Var2->sc_gobj).g_next = &x_01->sc_gobj;
            }
            (gp_00->gp_un).gp_scalar = x_01;
            templatesym._4_4_ = 0;
            gp = (t_gpointer *)x->x_variables;
            for (; templatesym._4_4_ < iVar3; templatesym._4_4_ = templatesym._4_4_ + 1) {
              template_setfloat(x_00,(t_symbol *)(gp->gp_un).gp_scalar,x_01->sc_vec,
                                (t_float)gp->gp_valid,1);
              gp = (t_gpointer *)&gp->gp_stub;
            }
            x_02 = glist_getcanvas(owner);
            iVar3 = glist_isvisible(x_02);
            if (iVar3 != 0) {
              gobj_vis(&x_01->sc_gobj,owner,1);
            }
            outlet_pointer((x->x_obj).te_outlet,gp_00);
          }
        }
      }
      else {
        pd_error(x,"append: stale pointer");
      }
    }
    else {
      pd_error(x,"append: lists only, not arrays");
    }
  }
  return;
}

Assistant:

static void append_float(t_append *x, t_float f)
{
    int nitems = x->x_nin, i;
    t_symbol *templatesym = x->x_templatesym;
    t_template *template;
    t_appendvariable *vp;
    t_gpointer *gp = &x->x_gp;
    t_gstub *gs = gp->gp_stub;
    t_word *vec;
    t_scalar *sc, *oldsc;
    t_glist *glist;

    if (!templatesym->s_name)
    {
        pd_error(x, "append: no template supplied");
        return;
    }
    template = template_findbyname(templatesym);
    if (!template)
    {
        pd_error(x, "append: couldn't find template %s", templatesym->s_name);
        return;
    }
    if (!gs)
    {
        pd_error(x, "append: no current pointer");
        return;
    }
    if (gs->gs_which != GP_GLIST)
    {
        pd_error(x, "append: lists only, not arrays");
        return;
    }
    glist = gs->gs_un.gs_glist;
    if (glist->gl_valid != gp->gp_valid)
    {
        pd_error(x, "append: stale pointer");
        return;
    }
    if (!nitems) return;
    x->x_variables[0].gv_f = f;

    sc = scalar_new(glist, templatesym);
    if (!sc)
    {
        pd_error(x, "%s: couldn't create scalar", templatesym->s_name);
        return;
    }
    oldsc = gp->gp_un.gp_scalar;

    if (oldsc)
    {
        sc->sc_gobj.g_next = oldsc->sc_gobj.g_next;
        oldsc->sc_gobj.g_next = &sc->sc_gobj;
    }
    else
    {
        sc->sc_gobj.g_next = glist->gl_list;
        glist->gl_list = &sc->sc_gobj;
    }

    gp->gp_un.gp_scalar = sc;
    vec = sc->sc_vec;
    for (i = 0, vp = x->x_variables; i < nitems; i++, vp++)
    {
        template_setfloat(template, vp->gv_sym, vec, vp->gv_f, 1);
    }

    if (glist_isvisible(glist_getcanvas(glist)))
        gobj_vis(&sc->sc_gobj, glist, 1);
    /*  scalar_redraw(sc, glist);  ... have to do 'vis' instead here because
    redraw assumes we're already visible??? ... */

    outlet_pointer(x->x_obj.ob_outlet, gp);
}